

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

char * data_to_hex(char *data,size_t len)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char *buffer;
  
  sVar2 = 0xff;
  if (len < 0xff) {
    sVar2 = len;
  }
  if (len == 0) {
    buffer = data_to_hex::buf;
  }
  else {
    buffer = data_to_hex::buf;
    sVar3 = 0;
    do {
      cVar1 = data[sVar3];
      if ((byte)(cVar1 + 0x81U) < 0xa1) {
        curl_msnprintf(buffer,4,"%%%02x",(ulong)(uint)(int)cVar1);
        buffer = buffer + 3;
      }
      else {
        *buffer = cVar1;
        buffer = buffer + 1;
      }
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  *buffer = '\0';
  return data_to_hex::buf;
}

Assistant:

char *data_to_hex(char *data, size_t len)
{
  static char buf[256*3];
  size_t i;
  char *optr = buf;
  char *iptr = data;

  if(len > 255)
    len = 255;

  for(i=0; i < len; i++) {
    if((data[i] >= 0x20) && (data[i] < 0x7f))
      *optr++ = *iptr++;
    else {
      snprintf(optr, 4, "%%%02x", *iptr++);
      optr+=3;
    }
  }
  *optr=0; /* in case no sprintf was used */

  return buf;
}